

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xreq.c
# Opt level: O2

void xreq0_getq_cb(void *arg)

{
  nni_aio *aio;
  nng_err nVar1;
  nni_msg *msg;
  
  aio = (nni_aio *)((long)arg + 0x10);
  nVar1 = nni_aio_result(aio);
  if (nVar1 != NNG_OK) {
    nni_pipe_close(*arg);
    return;
  }
  msg = nni_aio_get_msg(aio);
  nni_aio_set_msg((nni_aio *)((long)arg + 0x1d8),msg);
  nni_aio_set_msg(aio,(nni_msg *)0x0);
  nni_pipe_send(*arg,(nni_aio *)((long)arg + 0x1d8));
  return;
}

Assistant:

static void
xreq0_getq_cb(void *arg)
{
	xreq0_pipe *p = arg;

	if (nni_aio_result(&p->aio_getq) != 0) {
		nni_pipe_close(p->pipe);
		return;
	}

	nni_aio_set_msg(&p->aio_send, nni_aio_get_msg(&p->aio_getq));
	nni_aio_set_msg(&p->aio_getq, NULL);

	nni_pipe_send(p->pipe, &p->aio_send);
}